

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

void Fixpp::
     set<Fixpp::TagT<108u,Fixpp::Type::String>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::String>>,Fixpp::TagT<95u,Fixpp::Type::String>,Fixpp::TagT<96u,Fixpp::Type::String>,Fixpp::TagT<141u,Fixpp::Type::String>,Fixpp::TagT<383u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::TagT<2154u,Fixpp::Type::Int>>,char_const(&)[4]>
               (VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                *message,char (*value) [4])

{
  Field<Fixpp::TagT<108u,Fixpp::Type::String>>::set<char_const(&)[4]>
            ((Field<Fixpp::TagT<108u,Fixpp::Type::String>> *)
             &(message->
              super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
              ).
              super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
              .values.base.
              super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_false>,
             value);
  std::bitset<8UL>::set
            (&(message->
              super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
              ).
              super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
              .allBits,1,true);
  std::bitset<2UL>::set
            (&(message->
              super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
              ).
              super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
              .requiredBits,1,true);
  return;
}

Assistant:

decltype(auto)
    set(Message& message, Value&& value)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        using RequiredIndex = details::TagIndex<typename Message::RequiredList, Tag>;

        static_assert(Index::Valid, "Invalid tag for given message");
        static_assert(details::IsValidTypeFor<Tag, Value>::value, "Invalid data type for given Tag");

        meta::get<Index::Value>(message.values).set(std::forward<Value>(value));

        message.allBits.set(Index::Value);

        if (identity(RequiredIndex::Valid))
            message.requiredBits.set(static_cast<size_t>(RequiredIndex::Value));
    }